

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O1

void __thiscall i2p::sam::Session::~Session(Session *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Sock *pSVar3;
  pointer puVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = &(this->m_mutex).super_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  Disconnect(this);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  pcVar2 = (this->m_session_id)._M_dataplus._M_p;
  paVar1 = &(this->m_session_id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (0x10 < (this->m_my_addr).super_CNetAddr.m_addr._size) {
    free((this->m_my_addr).super_CNetAddr.m_addr._union.indirect_contents.indirect);
    (this->m_my_addr).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  pSVar3 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  if (pSVar3 != (Sock *)0x0) {
    (*pSVar3->_vptr_Sock[1])();
  }
  (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (Sock *)0x0;
  puVar4 = (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->m_private_key).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  pcVar2 = (this->m_control_host).m_unix_socket_path._M_dataplus._M_p;
  paVar1 = &(this->m_control_host).m_unix_socket_path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (0x10 < (this->m_control_host).proxy.super_CNetAddr.m_addr._size) {
    free((this->m_control_host).proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    (this->m_control_host).proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)0x0;
  }
  std::filesystem::__cxx11::path::~path((path *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Session::~Session()
{
    LOCK(m_mutex);
    Disconnect();
}